

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadLight(XMLLoader *this,Ref<embree::XML> *xml)

{
  undefined1 uVar1;
  bool bVar2;
  undefined1 uVar3;
  mapped_type *pmVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined8 *in_RDX;
  Ref<embree::XML> *in_RSI;
  Node *in_RDI;
  string id;
  char *in_stack_fffffffffffffb08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined7 in_stack_fffffffffffffb48;
  undefined1 in_stack_fffffffffffffb4f;
  string *in_stack_fffffffffffffb50;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
  *this_00;
  XML *in_stack_fffffffffffffb58;
  undefined7 in_stack_fffffffffffffbb8;
  Ref<embree::XML> *in_stack_fffffffffffffbc8;
  XMLLoader *in_stack_fffffffffffffbd0;
  Ref<embree::XML> *xml_00;
  XMLLoader *in_stack_fffffffffffffca8;
  Ref<embree::XML> *in_stack_fffffffffffffcc0;
  XMLLoader *in_stack_fffffffffffffcc8;
  undefined7 in_stack_fffffffffffffcd0;
  XMLLoader *this_01;
  Ref<embree::XML> *in_stack_fffffffffffffd38;
  XMLLoader *in_stack_fffffffffffffd40;
  string local_2b0 [32];
  long *local_290;
  long *local_288;
  long *local_280;
  long *local_278;
  long *local_270;
  long *local_268;
  long *local_260;
  undefined4 local_254;
  long *local_250 [3];
  Ref<embree::XML> *in_stack_fffffffffffffdc8;
  XMLLoader *in_stack_fffffffffffffdd0;
  string local_210 [32];
  undefined8 *local_1f0;
  undefined8 *local_1d8;
  undefined8 *local_1d0;
  undefined8 *local_1c8;
  undefined8 *local_1c0;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  undefined8 *local_1a8;
  undefined8 *local_1a0;
  undefined8 *local_198;
  undefined8 *local_190;
  long **local_180;
  mapped_type *local_178;
  long **local_170;
  mapped_type *local_168;
  long **local_160;
  mapped_type *local_158;
  long **local_150;
  mapped_type *local_148;
  long **local_140;
  mapped_type *local_138;
  long **local_130;
  mapped_type *local_128;
  long **local_120;
  mapped_type *local_118;
  long **local_110;
  mapped_type *local_108;
  mapped_type *local_100;
  mapped_type *local_f0;
  mapped_type *local_e0;
  mapped_type *local_d0;
  mapped_type *local_c0;
  mapped_type *local_b0;
  mapped_type *local_a0;
  mapped_type *local_90;
  long **local_80;
  long **local_70;
  long **local_60;
  long **local_50;
  long **local_40;
  long **local_30;
  long **local_20;
  long **local_10;
  
  this_01 = (XMLLoader *)*in_RDX;
  local_1f0 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffdd0,"id",(allocator *)&stack0xfffffffffffffdcf);
  XML::parm(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdcf);
  local_190 = local_1f0;
  uVar1 = std::operator==(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  if ((bool)uVar1) {
    loadPointLight(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                           *)in_stack_fffffffffffffb50,
                          (key_type *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48))
    ;
    local_110 = local_250;
    local_108 = pmVar4;
    if (pmVar4->ptr != (Node *)0x0) {
      (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
    }
    pmVar4->ptr = (Node *)*local_110;
    *local_110 = (long *)0x0;
    (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)pmVar4->ptr;
    local_100 = pmVar4;
    if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
      (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
    }
    local_80 = local_250;
    if (local_250[0] != (long *)0x0) {
      (**(code **)(*local_250[0] + 0x18))();
    }
  }
  else {
    local_198 = local_1f0;
    xml_00 = (Ref<embree::XML> *)*local_1f0;
    bVar2 = std::operator==(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
    if (bVar2) {
      loadSpotLight(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                             *)in_stack_fffffffffffffb50,
                            (key_type *)
                            CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
      local_120 = &local_260;
      local_118 = pmVar4;
      if (pmVar4->ptr != (Node *)0x0) {
        (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      pmVar4->ptr = (Node *)*local_120;
      *local_120 = (long *)0x0;
      (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)pmVar4->ptr;
      local_f0 = pmVar4;
      if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
        (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
      }
      local_70 = &local_260;
      if (local_260 != (long *)0x0) {
        (**(code **)(*local_260 + 0x18))();
      }
    }
    else {
      local_1a0 = local_1f0;
      bVar2 = std::operator==(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
      if (bVar2) {
        loadDirectionalLight(in_stack_fffffffffffffca8,xml_00);
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)in_stack_fffffffffffffb50,
                              (key_type *)
                              CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
        local_130 = &local_268;
        local_128 = pmVar4;
        if (pmVar4->ptr != (Node *)0x0) {
          (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        pmVar4->ptr = (Node *)*local_130;
        *local_130 = (long *)0x0;
        (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)pmVar4->ptr;
        local_e0 = pmVar4;
        if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
          (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
        }
        local_60 = &local_268;
        if (local_268 != (long *)0x0) {
          (**(code **)(*local_268 + 0x18))();
        }
      }
      else {
        local_1a8 = local_1f0;
        bVar2 = std::operator==(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
        if (bVar2) {
          loadDistantLight(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                 *)in_stack_fffffffffffffb50,
                                (key_type *)
                                CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
          local_140 = &local_270;
          local_138 = pmVar4;
          if (pmVar4->ptr != (Node *)0x0) {
            (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
          }
          pmVar4->ptr = (Node *)*local_140;
          *local_140 = (long *)0x0;
          (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)pmVar4->ptr;
          local_d0 = pmVar4;
          if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
            (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
          }
          local_50 = &local_270;
          if (local_270 != (long *)0x0) {
            (**(code **)(*local_270 + 0x18))();
          }
        }
        else {
          local_1b0 = local_1f0;
          bVar2 = std::operator==(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
          if (bVar2) {
            loadAmbientLight(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                   *)in_stack_fffffffffffffb50,
                                  (key_type *)
                                  CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
            local_150 = &local_278;
            local_148 = pmVar4;
            if (pmVar4->ptr != (Node *)0x0) {
              (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
            }
            pmVar4->ptr = (Node *)*local_150;
            *local_150 = (long *)0x0;
            (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)pmVar4->ptr;
            local_c0 = pmVar4;
            if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
              (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
            }
            local_40 = &local_278;
            if (local_278 != (long *)0x0) {
              (**(code **)(*local_278 + 0x18))();
            }
          }
          else {
            local_1b8 = local_1f0;
            uVar3 = std::operator==(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
            if ((bool)uVar3) {
              loadTriangleLight(this_01,in_RSI);
              pmVar4 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                     *)in_stack_fffffffffffffb50,
                                    (key_type *)
                                    CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
              local_160 = &local_280;
              local_158 = pmVar4;
              if (pmVar4->ptr != (Node *)0x0) {
                (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
              }
              pmVar4->ptr = (Node *)*local_160;
              *local_160 = (long *)0x0;
              (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)pmVar4->ptr;
              local_b0 = pmVar4;
              if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
                (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
              }
              local_30 = &local_280;
              if (local_280 != (long *)0x0) {
                (**(code **)(*local_280 + 0x18))();
              }
            }
            else {
              local_1c0 = local_1f0;
              bVar2 = std::operator==(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
              if (bVar2) {
                loadAnimatedLight((XMLLoader *)CONCAT17(uVar1,in_stack_fffffffffffffcd0),
                                  (Ref<embree::XML> *)in_stack_fffffffffffffcc8);
                pmVar4 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                       *)in_stack_fffffffffffffb50,
                                      (key_type *)
                                      CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48))
                ;
                local_170 = &local_288;
                local_168 = pmVar4;
                if (pmVar4->ptr != (Node *)0x0) {
                  (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
                }
                pmVar4->ptr = (Node *)*local_170;
                *local_170 = (long *)0x0;
                (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)pmVar4->ptr;
                local_a0 = pmVar4;
                if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
                  (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
                }
                local_20 = &local_288;
                if (local_288 != (long *)0x0) {
                  (**(code **)(*local_288 + 0x18))();
                }
              }
              else {
                local_1c8 = local_1f0;
                this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                           *)*local_1f0;
                uVar1 = std::operator==(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
                if (!(bool)uVar1) {
                  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          __cxa_allocate_exception(0x10);
                  local_1d0 = local_1f0;
                  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          *local_1f0;
                  ParseLocation::str_abi_cxx11_
                            ((ParseLocation *)CONCAT17(uVar3,in_stack_fffffffffffffbb8));
                  std::operator+(__lhs,(char *)__rhs);
                  local_1d8 = local_1f0;
                  std::operator+(__lhs,__rhs);
                  std::runtime_error::runtime_error((runtime_error *)__rhs,local_2b0);
                  __cxa_throw(__rhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                             );
                }
                loadQuadLight(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
                pmVar4 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                         ::operator[](this_00,(key_type *)CONCAT17(uVar1,in_stack_fffffffffffffb48))
                ;
                local_180 = &local_290;
                local_178 = pmVar4;
                if (pmVar4->ptr != (Node *)0x0) {
                  (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
                }
                pmVar4->ptr = (Node *)*local_180;
                *local_180 = (long *)0x0;
                (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)pmVar4->ptr;
                local_90 = pmVar4;
                if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
                  (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
                }
                local_10 = &local_290;
                if (local_290 != (long *)0x0) {
                  (**(code **)(*local_290 + 0x18))();
                }
              }
            }
          }
        }
      }
    }
  }
  local_254 = 1;
  std::__cxx11::string::~string(local_210);
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadLight(const Ref<XML>& xml) 
   {
     const std::string id = xml->parm("id");
     if      (xml->name == "PointLight"      ) return state.sceneMap[id] = loadPointLight      (xml);
     else if (xml->name == "SpotLight"       ) return state.sceneMap[id] = loadSpotLight       (xml);
     else if (xml->name == "DirectionalLight") return state.sceneMap[id] = loadDirectionalLight(xml);
     else if (xml->name == "DistantLight"    ) return state.sceneMap[id] = loadDistantLight    (xml);
     else if (xml->name == "AmbientLight"    ) return state.sceneMap[id] = loadAmbientLight    (xml);
     else if (xml->name == "TriangleLight"   ) return state.sceneMap[id] = loadTriangleLight   (xml);
     else if (xml->name == "AnimatedLight"   ) return state.sceneMap[id] = loadAnimatedLight   (xml);
     else if (xml->name == "QuadLight"       ) return state.sceneMap[id] = loadQuadLight       (xml);
     else THROW_RUNTIME_ERROR(xml->loc.str()+": invalid light node: "+xml->name);
   }